

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_ops.h
# Opt level: O0

uint mem_get_le24_as_int(void *vmem)

{
  uchar *mem;
  uint val;
  void *vmem_local;
  
  return (uint)*vmem |
         (uint)*(byte *)((long)vmem + 1) << 8 | (uint)*(byte *)((long)vmem + 2) << 0x10;
}

Assistant:

static unsigned MEM_VALUE_T mem_get_le24(const void *vmem) {
  unsigned MEM_VALUE_T val;
  const MAU_T *mem = (const MAU_T *)vmem;

  val = mem[2] << 16;
  val |= mem[1] << 8;
  val |= mem[0];
  return val;
}